

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_PerObjectMeshParameters * ON_PerObjectMeshParameters::Cast(ON_Object *p)

{
  bool bVar1;
  ON_PerObjectMeshParameters *pOVar2;
  
  if (p != (ON_Object *)0x0) {
    bVar1 = ON_Object::IsKindOf(p,&m_ON_PerObjectMeshParameters_class_rtti);
    pOVar2 = (ON_PerObjectMeshParameters *)0x0;
    if (bVar1) {
      pOVar2 = (ON_PerObjectMeshParameters *)p;
    }
    return pOVar2;
  }
  return (ON_PerObjectMeshParameters *)0x0;
}

Assistant:

ON_PerObjectMeshParameters* ON_PerObjectMeshParameters::FindOrCreate(const ON_Object* object,bool bCreate)
{
  if ( 0 == object )
    return 0;
  ON_PerObjectMeshParameters* ud = ON_PerObjectMeshParameters::Cast(object->GetUserData(ON_CLASS_ID(ON_PerObjectMeshParameters)));
  if ( !ud && bCreate )
  {
    ud = new ON_PerObjectMeshParameters();
    const_cast< ON_Object* >(object)->AttachUserData(ud);
  }
  return ud;
}